

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rust.cpp
# Opt level: O2

int test_rust_dummy(ITesting *t)

{
  char cVar1;
  size_t i;
  long lVar2;
  int32_t addr;
  ulong uVar3;
  char *pcVar4;
  char *__s;
  char ascii [18];
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  char hexdump [82];
  char local_138 [264];
  
  pcVar4 = ascii;
  puts("test_rust_dummy - Hello from C");
  printf("ITesting size=%zu\n",0x60);
  printf("t = %p\n",t);
  printf("t->Debug = %p\n",t->Debug);
  printf("AssertError: =  %p\n",t->AssertError);
  local_1b8._M_unused._M_object = (void *)0x0;
  local_1b8._8_8_ = 0;
  local_1a0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_rust.cpp:87:19)>
              ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/tests/test_rust.cpp:87:19)>
              ::_M_manager;
  __s = hexdump;
  uVar3 = 0;
  for (lVar2 = 0; lVar2 != 0x60; lVar2 = lVar2 + 1) {
    snprintf(__s,4,"%.2x ",(ulong)*(byte *)((long)&t->Debug + lVar2));
    cVar1 = *(char *)((long)&t->Debug + lVar2);
    if (cVar1 < ' ') {
      cVar1 = '.';
    }
    *pcVar4 = cVar1;
    pcVar4[1] = '\0';
    if ((~(uint)lVar2 & 0xf) == 0) {
      __s = hexdump;
      snprintf(local_138,0x100,"%.4x %s    %s",uVar3,__s,ascii);
      std::function<void_(const_char_*)>::operator()
                ((function<void_(const_char_*)> *)&local_1b8,local_138);
      uVar3 = (ulong)((int)uVar3 + 0x10);
      builtin_strncpy(ascii,"                  ",0x12);
      builtin_strncpy(hexdump,
                      "                                                                                  "
                      ,0x52);
      pcVar4 = ascii;
    }
    else {
      pcVar4 = pcVar4 + 1;
      if ((~(uint)lVar2 & 7) == 0) {
        __s[3] = ' ';
        __s = __s + 4;
      }
      else {
        __s = __s + 3;
      }
    }
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
  return 0;
}

Assistant:

DLL_EXPORT int test_rust_dummy(ITesting *t) {
    printf("test_rust_dummy - Hello from C\n");
    printf("ITesting size=%zu\n",sizeof(ITesting));
    printf("t = %p\n", (void *)t);
    printf("t->Debug = %p\n", (void *)t->Debug);
    printf("AssertError: =  %p\n", (void *)t->AssertError);
    HexDumpToConsole(t, sizeof(ITesting));
    return kTR_Pass;
}